

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventsProcessor.cpp
# Opt level: O1

void __thiscall
solitaire::events::EventsProcessor::tryAddCardsOnAnyTableauPile
          (EventsProcessor *this,MouseLeftButtonUpEventData *eventData)

{
  char cVar1;
  int iVar2;
  undefined8 in_RAX;
  undefined4 extraout_var;
  uint uVar3;
  undefined8 local_38;
  
  uVar3 = 0;
  local_38 = in_RAX;
  while( true ) {
    local_38 = CONCAT44(local_38._4_4_,uVar3);
    iVar2 = (*this->context->_vptr_Context[8])(this->context,&local_38);
    cVar1 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x18))
                      ((long *)CONCAT44(extraout_var,iVar2),&eventData->cardsInHandPosition);
    if (cVar1 != '\0') {
      local_38 = CONCAT44(uVar3,(undefined4)local_38);
      (*eventData->solitaire->_vptr_Solitaire[9])(eventData->solitaire,(long)&local_38 + 4);
      if ((eventData->cardsInHand->
          super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>).
          _M_impl.super__Vector_impl_data._M_start ==
          (eventData->cardsInHand->
          super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>).
          _M_impl.super__Vector_impl_data._M_finish) {
        return;
      }
    }
    if (5 < uVar3) break;
    uVar3 = uVar3 + 1;
  }
  return;
}

Assistant:

void EventsProcessor::tryAddCardsOnAnyTableauPile(
    const MouseLeftButtonUpEventData& eventData) const
{
    for (PileId id {0}; id < Solitaire::tableauPilesCount; ++id) {
        const auto& collider = context.getTableauPileCollider(id);
        if (collider.collidesWithCardsInHand(eventData.cardsInHandPosition) and
            tryAddCardOnTableauPileAndCheckIfHandEmpty(id, eventData))
            return;
    }
}